

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::Invalidate::logExecute
          (Invalidate *this,TestLog *log,size_t commandIndex)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1a0;
  size_t local_20;
  size_t commandIndex_local;
  TestLog *log_local;
  Invalidate *this_local;
  
  local_20 = commandIndex;
  commandIndex_local = (size_t)log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])": Invalidate mapped memory");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void				logExecute	(TestLog& log, size_t commandIndex) const
	{
		log << TestLog::Message << commandIndex << ": Invalidate mapped memory" << TestLog::EndMessage;
	}